

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int checkTreePage(IntegrityCk *pCheck,Pgno iPage,i64 *piMinKey,i64 maxKey)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  BtShared *pBt;
  bool bVar5;
  ushort uVar6;
  u16 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  char *zFormat;
  ulong uVar16;
  uint uVar17;
  ushort *puVar18;
  uint *puVar19;
  char *pcVar20;
  uint *puVar21;
  MemPage *pPage_00;
  MemPage *pPage;
  CellInfo info;
  int local_10c;
  i64 local_e8;
  int local_dc;
  u8 *local_d8;
  char *local_d0;
  u8 *local_c8;
  uint local_bc;
  ulong local_b8;
  ulong local_b0;
  BtShared *local_a8;
  MemPage *local_a0;
  uint local_94;
  int local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint *local_70;
  i64 *local_68;
  CellInfo local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a0 = (MemPage *)0x0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar20 = pCheck->zPfx;
  local_48._0_4_ = pCheck->v1;
  local_48._4_4_ = pCheck->v2;
  uStack_40 = 0;
  uVar10 = pBt->usableSize;
  local_e8 = maxKey;
  local_68 = piMinKey;
  iVar8 = checkRef(pCheck,iPage);
  if (iVar8 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %u: ";
  pCheck->v1 = iPage;
  uVar9 = btreeGetPage(pBt,iPage,&local_a0,0);
  pPage_00 = local_a0;
  if (uVar9 == 0) {
    uVar1 = local_a0->isInit;
    local_a0->isInit = '\0';
    local_b0 = (ulong)uVar10;
    uVar10 = btreeInitPage(local_a0);
    if (uVar10 == 0) {
      uVar10 = btreeComputeFreeSpace(pPage_00);
      uVar13 = local_b0;
      if (uVar10 == 0) {
        local_d8 = pPage_00->aData;
        local_80 = (ulong)pPage_00->hdrOffset;
        pCheck->zPfx = "On tree page %u cell %d: ";
        bVar2 = local_d8[local_80 + 5];
        bVar3 = local_d8[local_80 + 6];
        local_b8 = (ulong)local_d8[local_80 + 3] << 8;
        local_88 = (ulong)local_d8[local_80 + 4];
        local_78 = (ulong)((int)local_b8 + (uint)local_d8[local_80 + 4]);
        local_c8 = (u8 *)(local_80 - (uint)pPage_00->leaf * 4);
        local_d0 = pcVar20;
        local_a8 = pBt;
        if (pPage_00->leaf == 0) {
          uVar10 = *(uint *)(local_d8 + local_80 + 8);
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          if (pBt->autoVacuum != '\0') {
            pCheck->zPfx = "On page %u at right child: ";
            checkPtrmap(pCheck,uVar10,'\x05',iPage);
          }
          local_10c = checkTreePage(pCheck,uVar10,&local_e8,maxKey);
          puVar21 = (uint *)0x0;
          bVar5 = false;
        }
        else {
          puVar21 = pCheck->heap;
          *puVar21 = 0;
          local_10c = -1;
          bVar5 = true;
        }
        local_c8 = (u8 *)((long)local_c8 + 0xc);
        uVar10 = ((uint)bVar2 * 0x100 + (uint)bVar3) - 1 & 0xffff;
        if ((int)local_78 == 0) {
          *local_68 = local_e8;
          pCheck->zPfx = (char *)0x0;
LAB_0016bc54:
          pcVar20 = local_d0;
          if (0 < pCheck->mxErr) {
            if (pPage_00->leaf == '\0') {
              puVar21 = pCheck->heap;
              *puVar21 = 0;
              if ((int)local_78 != 0) {
                uVar13 = (ulong)((uint)local_b8 | (uint)local_88);
                local_c8 = local_c8 + (long)local_d8;
                do {
                  uVar6 = *(ushort *)(local_c8 + uVar13 * 2 + -2) << 8 |
                          *(ushort *)(local_c8 + uVar13 * 2 + -2) >> 8;
                  local_b8 = uVar13;
                  uVar7 = (*pPage_00->xCellSize)(pPage_00,local_d8 + uVar6);
                  uVar9 = *puVar21 + 1;
                  *puVar21 = uVar9;
                  puVar21[uVar9] = ((uint)uVar6 + (uint)uVar7) - 1 | (uint)uVar6 << 0x10;
                  uVar13 = (ulong)uVar9;
                  if (1 < uVar9) {
                    do {
                      uVar16 = uVar13 >> 1;
                      uVar9 = puVar21[uVar16];
                      if (uVar9 <= puVar21[uVar13]) break;
                      puVar21[uVar16] = puVar21[uVar13];
                      puVar21[uVar13] = uVar9;
                      uVar9 = (uint)uVar13;
                      uVar13 = uVar16;
                    } while (3 < uVar9);
                  }
                  uVar13 = local_b8 - 1;
                } while (1 < (long)local_b8);
              }
            }
            for (uVar6 = *(ushort *)(local_d8 + local_80 + 1) << 8 |
                         *(ushort *)(local_d8 + local_80 + 1) >> 8; uVar6 != 0;
                uVar6 = *(ushort *)(local_d8 + uVar6) << 8 | *(ushort *)(local_d8 + uVar6) >> 8) {
              uVar4 = *(ushort *)(local_d8 + (ulong)uVar6 + 2);
              uVar9 = *puVar21 + 1;
              *puVar21 = uVar9;
              puVar21[uVar9] =
                   ((uint)(ushort)(uVar4 << 8 | uVar4 >> 8) + (uint)uVar6) - 1 | (uint)uVar6 << 0x10
              ;
              uVar13 = (ulong)uVar9;
              if (1 < uVar9) {
                do {
                  uVar16 = uVar13 >> 1;
                  uVar9 = puVar21[uVar16];
                  if (uVar9 <= puVar21[uVar13]) break;
                  puVar21[uVar16] = puVar21[uVar13];
                  puVar21[uVar13] = uVar9;
                  uVar9 = (uint)uVar13;
                  uVar13 = uVar16;
                } while (3 < uVar9);
              }
            }
            iVar8 = 0;
            uVar9 = *puVar21;
            while (uVar9 != 0) {
              uVar14 = puVar21[1];
              puVar21[1] = puVar21[uVar9];
              puVar21[uVar9] = 0xffffffff;
              uVar12 = uVar9 - 1;
              *puVar21 = uVar12;
              if (2 < uVar9) {
                uVar9 = puVar21[1];
                uVar13 = (ulong)((puVar21[3] < puVar21[2]) + 2);
                uVar17 = puVar21[uVar13];
                if (uVar17 <= uVar9) {
                  puVar19 = puVar21 + uVar13;
                  uVar16 = 1;
                  do {
                    uVar15 = uVar13;
                    puVar21[uVar16] = uVar17;
                    *puVar19 = uVar9;
                    uVar17 = (int)uVar15 * 2;
                    uVar12 = *puVar21;
                    if (uVar12 < uVar17) break;
                    uVar13 = (ulong)(uVar17 | 1);
                    if (puVar21[uVar17] <= puVar21[uVar13]) {
                      uVar13 = (ulong)uVar17;
                    }
                    puVar19 = puVar21 + uVar13;
                    uVar17 = *puVar19;
                    uVar16 = uVar15;
                  } while (uVar17 <= uVar9);
                }
              }
              uVar9 = uVar14 >> 0x10;
              if (uVar9 <= (uVar10 & 0xffff)) {
                checkAppendMsg(pCheck,"Multiple uses for byte %u of page %u",uVar9,iPage);
                pcVar20 = local_d0;
                if (*puVar21 != 0) goto LAB_0016b77a;
                break;
              }
              iVar8 = iVar8 + ~(uVar10 & 0xffff) + uVar9;
              uVar10 = uVar14;
              uVar9 = uVar12;
            }
            uVar10 = (int)local_b0 + (~uVar10 | 0xffff0000) + iVar8;
            pcVar20 = local_d0;
            if (uVar10 != local_d8[local_80 + 7]) {
              checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %u",
                             (ulong)uVar10,(ulong)local_d8[local_80 + 7],iPage);
              pcVar20 = local_d0;
            }
          }
          goto LAB_0016b77a;
        }
        local_8c = uVar10 + 1;
        puVar18 = (ushort *)(local_d8 + ((int)local_c8 + (int)local_78 * 2 + -2));
        iVar8 = (int)local_b8 + (int)local_88;
        local_bc = (int)uVar13 - 4;
        local_90 = (int)uVar13 + -5;
        local_dc = 1;
        do {
          iVar8 = iVar8 + -1;
          if (pCheck->mxErr == 0) break;
          pCheck->v2 = iVar8;
          uVar6 = *puVar18 << 8 | *puVar18 >> 8;
          uVar9 = (uint)uVar6;
          if (local_bc < uVar6 || uVar6 <= uVar10) {
            local_dc = 0;
            checkAppendMsg(pCheck,"Offset %d out of range %d..%d",(ulong)uVar9,(ulong)local_8c);
          }
          else {
            local_70 = (uint *)(local_d8 + uVar9);
            (*pPage_00->xParseCell)(pPage_00,(u8 *)local_70,&local_60);
            if ((uint)local_b0 < local_60.nSize + uVar9) {
              local_dc = 0;
              checkAppendMsg(pCheck,"Extends off end of page");
            }
            else {
              if (pPage_00->intKey != '\0') {
                if (bVar5) {
                  if (local_e8 < local_60.nKey) {
LAB_0016ba6b:
                    checkAppendMsg(pCheck,"Rowid %lld out of order");
                  }
                }
                else if (local_e8 <= local_60.nKey) goto LAB_0016ba6b;
                bVar5 = false;
                local_e8 = local_60.nKey;
              }
              if (local_60.nLocal < local_60.nPayload) {
                uVar12 = ((local_60.nPayload + local_90) - (uint)local_60.nLocal) / local_bc;
                uVar14 = *(uint *)((long)local_70 + ((ulong)local_60.nSize - 4));
                uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                         uVar14 << 0x18;
                if (local_a8->autoVacuum != '\0') {
                  local_94 = uVar14;
                  checkPtrmap(pCheck,uVar14,'\x03',iPage);
                  uVar14 = local_94;
                }
                checkList(pCheck,0,uVar14,uVar12);
              }
              if (pPage_00->leaf == '\0') {
                uVar9 = *local_70;
                uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                        uVar9 << 0x18;
                if (local_a8->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar9,'\x05',iPage);
                }
                iVar11 = checkTreePage(pCheck,uVar9,&local_e8,local_e8);
                if (iVar11 == local_10c) {
                  bVar5 = false;
                }
                else {
                  bVar5 = false;
                  checkAppendMsg(pCheck,"Child page depth differs");
                  local_10c = iVar11;
                }
              }
              else {
                uVar14 = *puVar21 + 1;
                uVar13 = (ulong)uVar14;
                *puVar21 = uVar14;
                puVar21[uVar13] = ((uint)uVar6 + (uint)local_60.nSize) - 1 | uVar9 << 0x10;
                if (1 < uVar14) {
                  do {
                    uVar16 = uVar13 >> 1;
                    uVar9 = puVar21[uVar16];
                    if (uVar9 <= puVar21[uVar13]) break;
                    puVar21[uVar16] = puVar21[uVar13];
                    puVar21[uVar13] = uVar9;
                    uVar9 = (uint)uVar13;
                    uVar13 = uVar16;
                  } while (3 < uVar9);
                }
              }
            }
          }
          puVar18 = puVar18 + -1;
        } while (0 < iVar8);
        *local_68 = local_e8;
        pCheck->zPfx = (char *)0x0;
        if (local_dc != 0) goto LAB_0016bc54;
        pPage_00->isInit = uVar1;
        pcVar20 = local_d0;
        goto LAB_0016b7cf;
      }
      zFormat = "free space corruption";
    }
    else {
      zFormat = "btreeInitPage() returns error code %d";
    }
    checkAppendMsg(pCheck,zFormat,(ulong)uVar10);
    local_10c = -1;
  }
  else {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar9);
    local_10c = -1;
    pPage_00 = local_a0;
LAB_0016b77a:
    if (pPage_00 == (MemPage *)0x0) goto LAB_0016b7dc;
  }
LAB_0016b7cf:
  sqlite3PagerUnrefNotNull(pPage_00->pDbPage);
LAB_0016b7dc:
  pCheck->zPfx = pcVar20;
  pCheck->v1 = (undefined4)local_48;
  pCheck->v2 = local_48._4_4_;
  return local_10c + 1;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  Pgno iPage,           /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %u: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %u cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %u at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page.
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    **
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %u", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %u",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}